

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

void __thiscall
ON_TextDot::ON_TextDot
          (ON_TextDot *this,ON_3dPoint center_point,wchar_t *primary_text,wchar_t *secondary_text)

{
  double dVar1;
  bool bVar2;
  ON_3dPoint *this_00;
  
  this_00 = &center_point;
  ON_Object::ON_Object((ON_Object *)this);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00811430;
  bVar2 = ON_3dPoint::IsValid(this_00);
  if (!bVar2) {
    this_00 = &ON_3dPoint::UnsetPoint;
  }
  (this->m_center_point).z = this_00->z;
  dVar1 = this_00->y;
  (this->m_center_point).x = this_00->x;
  (this->m_center_point).y = dVar1;
  ON_wString::ON_wString(&this->m_primary_text,primary_text);
  ON_wString::ON_wString(&this->m_secondary_text,secondary_text);
  ON_wString::ON_wString(&this->m_font_face);
  this->m_display_bits = 0;
  this->m_height_in_points = 0xe;
  return;
}

Assistant:

ON_TextDot::ON_TextDot(
  ON_3dPoint center_point,
  const wchar_t* primary_text,
  const wchar_t* secondary_text
  )
  : m_center_point(  center_point.IsValid() ? center_point : ON_3dPoint::UnsetPoint )
  , m_primary_text(primary_text)
  , m_secondary_text(secondary_text)
{
}